

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  int *piVar1;
  u8 uVar2;
  u32 uVar3;
  u32 uVar4;
  sqlite3_mutex *psVar5;
  Btree *pBVar6;
  Pager *pPVar7;
  Pager *pPager;
  BtShared *pBVar8;
  BtShared *pBVar9;
  sqlite3_file *pFile;
  uint uVar10;
  long iSize;
  long lVar11;
  uint uVar12;
  Pgno PVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  DbPage *pSrcPg;
  DbPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = p->pSrcDb->mutex;
  if (psVar5 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
  }
  pBVar6 = p->pSrc;
  if ((pBVar6->sharable != '\0') &&
     (pBVar6->wantToLock = pBVar6->wantToLock + 1, pBVar6->locked == '\0')) {
    btreeLockCarefully(pBVar6);
  }
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar5 = p->pDestDb->mutex, psVar5 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
  }
  uVar10 = p->rc;
  if ((6 < uVar10) || ((0x61U >> (uVar10 & 0x1f) & 1) == 0)) goto LAB_0012371d;
  pBVar6 = p->pSrc;
  pPVar7 = pBVar6->pBt->pPager;
  pPager = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar6->pBt->inTransaction != '\x02')) {
    uVar12 = 0;
    bVar17 = pBVar6->inTrans != '\0';
    if (!bVar17) {
      uVar12 = btreeBeginTrans(pBVar6,0,(int *)0x0);
    }
    iVar15 = p->bDestLocked;
    if (iVar15 == 0 && uVar12 == 0) {
      iVar15 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,0,0);
      uVar12 = 7;
      if (iVar15 != 7) {
        iVar15 = p->bDestLocked;
LAB_001232b9:
        uVar12 = 0;
        if ((iVar15 == 0) &&
           (uVar12 = sqlite3BtreeBeginTrans(p->pDest,2,(int *)&p->iDestSchema), uVar12 == 0)) {
          p->bDestLocked = 1;
          uVar12 = 0;
        }
      }
    }
    else if (uVar12 == 0) goto LAB_001232b9;
  }
  else {
    bVar17 = true;
    uVar12 = 5;
  }
  pBVar8 = p->pSrc->pBt;
  uVar3 = pBVar8->pageSize;
  lVar11 = (long)(int)uVar3;
  pBVar9 = p->pDest->pBt;
  uVar4 = pBVar9->pageSize;
  uVar2 = pBVar9->pPager->journalMode;
  if (uVar12 == 0) {
    uVar12 = 0;
    if (uVar2 != '\x05') {
      bVar18 = false;
      if (pPager->tempFile == '\0') {
        bVar18 = pPager->memVfs == '\0';
      }
      if (bVar18) goto LAB_0012333a;
    }
    if (uVar3 != uVar4) {
      uVar12 = 8;
    }
  }
LAB_0012333a:
  uVar10 = pBVar8->nPage;
  if (nPage != 0) {
    PVar13 = p->iNext;
    iVar15 = 1;
    do {
      if ((uVar10 < PVar13) || (uVar12 != 0)) break;
      uVar12 = 0;
      if (PVar13 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
        local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
        uVar12 = (*pPVar7->xGet)(pPVar7,PVar13,&local_40,2);
        if ((uVar12 == 0) &&
           (uVar12 = backupOnePage(p,PVar13,(u8 *)local_40->pData,0), local_40 != (DbPage *)0x0)) {
          sqlite3PagerUnrefNotNull(local_40);
        }
        PVar13 = p->iNext;
      }
      PVar13 = PVar13 + 1;
      p->iNext = PVar13;
      bVar18 = iVar15 < nPage;
      iVar15 = iVar15 + 1;
    } while (bVar18 || nPage < 0);
  }
  if (uVar12 == 0x65) {
LAB_00123422:
    if (uVar10 == 0) {
      pBVar6 = p->pDest;
      if ((pBVar6->sharable != '\0') &&
         (pBVar6->wantToLock = pBVar6->wantToLock + 1, pBVar6->locked == '\0')) {
        btreeLockCarefully(pBVar6);
      }
      pBVar8 = pBVar6->pBt;
      pBVar8->nPage = 0;
      uVar12 = newDatabase(pBVar8);
      if (pBVar6->sharable != '\0') {
        piVar1 = &pBVar6->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar6);
        }
      }
      uVar10 = 1;
      if ((uVar12 != 0x65) && (uVar12 != 0)) goto LAB_001236ec;
    }
    uVar12 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar12 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if ((uVar2 != '\x05') || (uVar12 = sqlite3BtreeSetVersion(p->pDest,2), uVar12 == 0)) {
        if ((int)uVar3 < (int)uVar4) {
          iVar15 = (int)(uVar10 + (int)uVar4 / (int)uVar3 + -1) / ((int)uVar4 / (int)uVar3);
          PVar13 = iVar15 - (uint)(iVar15 == (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1)
          ;
          iSize = (int)uVar10 * lVar11;
          pFile = pPager->fd;
          uVar10 = pPager->dbSize;
          if (uVar10 < PVar13) {
LAB_001235d7:
            uVar12 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,1);
          }
          else {
            do {
              uVar12 = 0;
              if (PVar13 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) {
                local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
                uVar12 = (*pPager->xGet)(pPager,PVar13,&local_40,0);
                if ((uVar12 == 0) &&
                   (uVar12 = sqlite3PagerWrite(local_40), local_40 != (DbPage *)0x0)) {
                  sqlite3PagerUnrefNotNull(local_40);
                }
              }
            } while ((uVar12 == 0) && (PVar13 = PVar13 + 1, PVar13 <= uVar10));
            if (uVar12 == 0) goto LAB_001235d7;
          }
          lVar16 = (long)(int)(uVar4 + sqlite3PendingByte);
          if (iSize < (int)(uVar4 + sqlite3PendingByte)) {
            lVar16 = iSize;
          }
          bVar18 = uVar12 == 0;
          if ((bVar18) && (lVar14 = (long)(int)(sqlite3PendingByte + uVar3), lVar14 < lVar16)) {
            do {
              local_40 = (DbPage *)0x0;
              uVar12 = (*pPVar7->xGet)(pPVar7,(int)(lVar14 / lVar11) + 1,&local_40,0);
              if (uVar12 == 0) {
                uVar12 = (*pFile->pMethods->xWrite)(pFile,local_40->pData,uVar3,lVar14);
              }
              if (local_40 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_40);
              }
              bVar18 = uVar12 == 0;
            } while ((bVar18) && (lVar14 = lVar14 + lVar11, lVar14 < lVar16));
          }
          if ((!bVar18) || (uVar12 = backupTruncateFile(pFile,iSize), uVar12 != 0))
          goto LAB_001236ec;
          uVar12 = sqlite3PagerSync(pPager,(char *)0x0);
        }
        else {
          pPager->dbSize = ((int)uVar3 / (int)uVar4) * uVar10;
          uVar12 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,0);
        }
        if (uVar12 == 0) {
          uVar10 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar12 = 0x65;
          if (uVar10 != 0) {
            uVar12 = uVar10;
          }
        }
      }
    }
  }
  else if (uVar12 == 0) {
    p->nPagecount = uVar10;
    p->nRemaining = (uVar10 - p->iNext) + 1;
    if (uVar10 < p->iNext) goto LAB_00123422;
    uVar12 = 0;
    if (p->isAttached == 0) {
      pPVar7 = p->pSrc->pBt->pPager;
      p->pNext = pPVar7->pBackup;
      pPVar7->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_001236ec:
  if (!bVar17) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar10 = 7;
  if (uVar12 != 0xc0a) {
    uVar10 = uVar12;
  }
  p->rc = uVar10;
LAB_0012371d:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar5 = p->pDestDb->mutex, psVar5 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  pBVar6 = p->pSrc;
  if (pBVar6->sharable != '\0') {
    piVar1 = &pBVar6->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(pBVar6);
    }
  }
  psVar5 = p->pSrcDb->mutex;
  if (psVar5 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar10;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && SQLITE_TXN_NONE==sqlite3BtreeTxnState(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema))
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc
     && (destMode==PAGER_JOURNALMODE_WAL || sqlite3PagerIsMemdb(pDestPager))
     && pgszSrc!=pgszDest
    ){
      rc = SQLITE_READONLY;
    }

    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }

    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size.
        **
        ** If the source page size is smaller than the destination page size,
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc;
            rc==SQLITE_OK && iOff<iEnd;
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }

        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }

    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }

    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}